

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O1

void __thiscall irr::video::CImage::fill(CImage *this,SColor *color)

{
  ECOLOR_FORMAT format;
  uint uVar1;
  u8 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  u32 uVar7;
  uint uVar8;
  undefined8 in_RAX;
  long lVar9;
  ulong uVar10;
  u32 *d;
  uint *puVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  u8 rgb [3];
  undefined8 uStack_28;
  
  format = (this->super_IImage).Format;
  switch(format) {
  case ECF_A1R5G5B5:
    uVar6 = color->color;
    uVar6 = uVar6 >> 3 & 0x1f | uVar6 >> 6 & 0x3e0 | uVar6 >> 9 & 0x7c00 | uVar6 >> 0x10 & 0x8000;
    break;
  case ECF_R5G6B5:
    uVar6 = color->color;
    uVar6 = uVar6 >> 3 & 0x1f | uVar6 >> 5 & 0x7e0 | uVar6 >> 8 & 0xf800;
    break;
  case ECF_R8G8B8:
    uStack_28 = in_RAX;
    CColorConverter::convert_A8R8G8B8toR8G8B8(color,1,(void *)((long)&uStack_28 + 5));
    uVar6 = (this->super_IImage).Size.Height;
    uVar8 = (this->super_IImage).Size.Width;
    uVar7 = IImage::getBitsPerPixelFromFormat((this->super_IImage).Format);
    uVar6 = (uVar7 >> 3) * uVar6 * uVar8;
    if (uVar6 == 0) {
      return;
    }
    uVar8 = 0;
    do {
      puVar2 = (this->super_IImage).Data;
      puVar2[(ulong)uVar8 + 2] = uStack_28._7_1_;
      *(undefined2 *)(puVar2 + uVar8) = uStack_28._5_2_;
      uVar8 = uVar8 + 3;
    } while (uVar8 < uVar6);
    return;
  case ECF_A8R8G8B8:
    uVar6 = color->color;
    goto LAB_001ffa0b;
  default:
    goto switchD_001ff955_default;
  }
  uVar6 = uVar6 << 0x10 | uVar6;
LAB_001ffa0b:
  puVar11 = (uint *)(this->super_IImage).Data;
  uVar8 = (this->super_IImage).Size.Height;
  uVar1 = (this->super_IImage).Size.Width;
  uVar7 = IImage::getBitsPerPixelFromFormat(format);
  uVar8 = (uVar7 >> 3) * uVar8 * uVar1;
  if (0x1f < uVar8) {
    uVar10 = (ulong)(uVar8 >> 5);
    do {
      *puVar11 = uVar6;
      puVar11[1] = uVar6;
      puVar11[2] = uVar6;
      puVar11[3] = uVar6;
      puVar11[4] = uVar6;
      puVar11[5] = uVar6;
      puVar11[6] = uVar6;
      puVar11[7] = uVar6;
      puVar11 = puVar11 + 8;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  auVar5 = _DAT_002323d0;
  auVar4 = _DAT_002323c0;
  auVar3 = _DAT_0022c020;
  uVar8 = uVar8 >> 2 & 7;
  if (uVar8 != 0) {
    lVar9 = (ulong)uVar8 - 1;
    auVar12._8_4_ = (int)lVar9;
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar10 = 0;
    auVar12 = auVar12 ^ _DAT_0022c020;
    do {
      auVar14._8_4_ = (int)uVar10;
      auVar14._0_8_ = uVar10;
      auVar14._12_4_ = (int)(uVar10 >> 0x20);
      auVar15 = (auVar14 | auVar5) ^ auVar3;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        puVar11[uVar10] = uVar6;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        puVar11[uVar10 + 1] = uVar6;
      }
      auVar14 = (auVar14 | auVar4) ^ auVar3;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        puVar11[uVar10 + 2] = uVar6;
        puVar11[uVar10 + 3] = uVar6;
      }
      uVar10 = uVar10 + 4;
    } while ((uVar8 + 3 & 0xfffffffc) != uVar10);
  }
switchD_001ff955_default:
  return;
}

Assistant:

void CImage::fill(const SColor &color)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::fill method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	u32 c;

	switch (Format) {
	case ECF_A1R5G5B5:
		c = color.toA1R5G5B5();
		c |= c << 16;
		break;
	case ECF_R5G6B5:
		c = video::A8R8G8B8toR5G6B5(color.color);
		c |= c << 16;
		break;
	case ECF_A8R8G8B8:
		c = color.color;
		break;
	case ECF_R8G8B8: {
		u8 rgb[3];
		CColorConverter::convert_A8R8G8B8toR8G8B8(&color, 1, rgb);
		const u32 size = getImageDataSizeInBytes();
		for (u32 i = 0; i < size; i += 3) {
			memcpy(Data + i, rgb, 3);
		}
		return;
	} break;
	default:
		// TODO: Handle other formats
		return;
	}
	memset32(Data, c, getImageDataSizeInBytes());
}